

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericDatum.hh
# Opt level: O3

void __thiscall
avro::GenericDatum::GenericDatum<avro::GenericFixed>
          (GenericDatum *this,NodePtr *schema,GenericFixed *v)

{
  GenericFixed *this_00;
  
  this->type_ = schema->px->type_;
  (this->value_).content = (placeholder *)0x0;
  init(this,(EVP_PKEY_CTX *)schema);
  this_00 = boost::any_cast<avro::GenericFixed>(&this->value_);
  boost::shared_ptr<avro::Node>::operator=
            ((shared_ptr<avro::Node> *)this_00,(shared_ptr<avro::Node> *)v);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&this_00->value_,&v->value_)
  ;
  return;
}

Assistant:

GenericDatum(const NodePtr& schema, const T& v) :
        type_(schema->type()) {
        init(schema);
        value<T>() = v;
    }